

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

DebugMLTSampler * __thiscall
pbrt::DebugMLTSampler::Create
          (DebugMLTSampler *__return_storage_ptr__,DebugMLTSampler *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          state,int nSampleStreams)

{
  bool bVar1;
  float *ptr;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _Alloc_hider *p_Var3;
  string_view str;
  
  ptr = (float *)state.n;
  DebugMLTSampler(__return_storage_ptr__,(int)state.n);
  std::vector<float,_std::allocator<float>_>::resize
            (&__return_storage_ptr__->u,(size_type)state.ptr);
  p_Var3 = (_Alloc_hider *)((long)&((state.ptr)->_M_dataplus)._M_p + 1);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &this[-1].super_MLTSampler.streamIndex;
  lVar2 = 0;
  do {
    p_Var3 = (_Alloc_hider *)((long)(p_Var3 + 0xffffffffffffffff) + 7);
    if (p_Var3 == (_Alloc_hider *)0x0) {
      return __return_storage_ptr__;
    }
    str._M_str = (char *)((long)(__return_storage_ptr__->u).
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar2);
    str._M_len = (size_t)args[1]._M_dataplus._M_p;
    bVar1 = Atof((pbrt *)args[1]._M_string_length,str,ptr);
    lVar2 = lVar2 + 4;
    args = args + 1;
  } while (bVar1);
  ErrorExit<std::__cxx11::string_const&>("Invalid value in --debugstate: %s",args);
}

Assistant:

DebugMLTSampler DebugMLTSampler::Create(pstd::span<const std::string> state,
                                        int nSampleStreams) {
    DebugMLTSampler ds(nSampleStreams);
    ds.u.resize(state.size());
    for (size_t i = 0; i < state.size(); ++i) {
#ifdef PBRT_FLOAT_AS_DOUBLE
        if (!Atod(state[i], &ds.u[i]))
#else
        if (!Atof(state[i], &ds.u[i]))
#endif
            ErrorExit("Invalid value in --debugstate: %s", state[i]);
    }
    return ds;
}